

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterNaive.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::ssc::SscWriterNaive::EndStep(SscWriterNaive *this,bool writerLocked)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  int *piVar5;
  reference pvVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  int *piVar9;
  undefined1 in_SIL;
  Buffer *in_RDI;
  BlockVec *unaff_retaddr;
  Buffer *in_stack_00000018;
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
  *in_stack_00000020;
  size_t i;
  vector<int,_std::allocator<int>_> displs;
  Buffer globalBuffer;
  int globalSize;
  vector<int,_std::allocator<int>_> localSizes;
  int localSize;
  Buffer *in_stack_00000ac8;
  IO *in_stack_00000ad0;
  undefined8 in_stack_fffffffffffffed8;
  uint uVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  Buffer *pBVar11;
  allocator_type *in_stack_fffffffffffffef0;
  size_type in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 uVar12;
  ulong local_90;
  vector<int,_std::allocator<int>_> local_80;
  Buffer local_68;
  int *local_50;
  int *local_48;
  int local_40 [6];
  vector<int,_std::allocator<int>_> local_28;
  undefined4 local_10;
  undefined3 in_stack_fffffffffffffff4;
  uint rank;
  
  uVar10 = (uint)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  rank = CONCAT13(in_SIL,in_stack_fffffffffffffff4) & 0x1ffffff;
  pBVar11 = in_RDI;
  sVar3 = Buffer::size((Buffer *)&in_RDI[2].m_Size);
  puVar4 = Buffer::value<unsigned_long>((Buffer *)&in_RDI[2].m_Size,0);
  *puVar4 = sVar3;
  sVar3 = Buffer::size((Buffer *)&in_RDI[2].m_Size);
  puVar4 = Buffer::value<unsigned_long>((Buffer *)&in_RDI[2].m_Size,8);
  *puVar4 = sVar3;
  if (*(int *)&in_RDI[1].m_Buffer == 0) {
    SerializeStructDefinitions(in_stack_00000020,in_stack_00000018);
  }
  if (*(int *)&in_RDI[1].m_Buffer == *(int *)((long)&in_RDI[1].m_Buffer + 4) + -1) {
    SerializeAttributes(in_stack_00000ad0,in_stack_00000ac8);
  }
  SerializeVariables(unaff_retaddr,pBVar11,rank);
  puVar4 = Buffer::value<unsigned_long>((Buffer *)&in_RDI[2].m_Size,0);
  local_10 = (undefined4)*puVar4;
  std::allocator<int>::allocator((allocator<int> *)0x1d66b6);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
             ,in_stack_fffffffffffffef0);
  std::allocator<int>::~allocator((allocator<int> *)0x1d66dc);
  piVar5 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x1d66e9);
  __first._M_current = (int *)in_RDI[1].m_Capacity;
  __last._M_current = (int *)((ulong)uVar10 << 0x20);
  MPI_Gather(&local_10,1,&ompi_mpi_int,piVar5);
  local_48 = (int *)std::vector<int,_std::allocator<int>_>::begin(__last._M_current);
  local_50 = (int *)std::vector<int,_std::allocator<int>_>::end(__last._M_current);
  local_40[0] = std::
                accumulate<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                          (__first,__last,0);
  Buffer::Buffer((Buffer *)__first._M_current,(size_t)__last._M_current);
  std::allocator<int>::allocator((allocator<int> *)0x1d67b5);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
             ,in_stack_fffffffffffffef0);
  std::allocator<int>::~allocator((allocator<int> *)0x1d67db);
  for (local_90 = 1; local_90 < (ulong)(long)*(int *)((long)&in_RDI[1].m_Buffer + 4);
      local_90 = local_90 + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,local_90 - 1);
    iVar1 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,local_90 - 1);
    iVar2 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,local_90);
    *pvVar6 = iVar1 + iVar2;
  }
  puVar7 = Buffer::data((Buffer *)&in_RDI[2].m_Size,0);
  uVar12 = local_10;
  puVar8 = Buffer::data(&local_68,0);
  piVar5 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x1d692e);
  piVar9 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x1d6940);
  pBVar11 = (Buffer *)((ulong)__first._M_current & 0xffffffff00000000);
  MPI_Gatherv(puVar7,uVar12,&ompi_mpi_char,puVar8,piVar5,piVar9,&ompi_mpi_char,pBVar11,
              in_RDI[1].m_Capacity);
  if (*(int *)&in_RDI[1].m_Buffer == 0) {
    MPI_Send(local_40,1,&ompi_mpi_int,*(undefined4 *)((long)&in_RDI[2].m_Capacity + 4),0,
             in_RDI->m_Buffer);
    in_stack_fffffffffffffef0 = (allocator_type *)Buffer::data(&local_68,0);
    MPI_Send(in_stack_fffffffffffffef0,local_40[0],&ompi_mpi_char,
             *(undefined4 *)((long)&in_RDI[2].m_Capacity + 4),0,in_RDI->m_Buffer);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef0);
  Buffer::~Buffer(pBVar11);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef0);
  return;
}

Assistant:

void SscWriterNaive::EndStep(const bool writerLocked)
{
    m_Buffer.value<uint64_t>() = m_Buffer.size();
    m_Buffer.value<uint64_t>(8) = m_Buffer.size();

    if (m_WriterRank == 0)
    {
        ssc::SerializeStructDefinitions(m_IO.m_ADIOS.m_StructDefinitions, m_Buffer);
    }

    if (m_WriterRank == m_WriterSize - 1)
    {
        ssc::SerializeAttributes(m_IO, m_Buffer);
    }

    ssc::SerializeVariables(m_Metadata, m_Buffer, m_WriterRank);

    int localSize = static_cast<int>(m_Buffer.value<uint64_t>());
    std::vector<int> localSizes(m_WriterSize);
    MPI_Gather(&localSize, 1, MPI_INT, localSizes.data(), 1, MPI_INT, 0, m_WriterComm);
    int globalSize = std::accumulate(localSizes.begin(), localSizes.end(), 0);
    ssc::Buffer globalBuffer(globalSize);

    std::vector<int> displs(m_WriterSize);
    for (size_t i = 1; i < static_cast<size_t>(m_WriterSize); ++i)
    {
        displs[i] = displs[i - 1] + localSizes[i - 1];
    }

    MPI_Gatherv(m_Buffer.data(), localSize, MPI_CHAR, globalBuffer.data(), localSizes.data(),
                displs.data(), MPI_CHAR, 0, m_WriterComm);

    if (m_WriterRank == 0)
    {
        MPI_Send(&globalSize, 1, MPI_INT, m_ReaderMasterStreamRank, 0, m_StreamComm);
        MPI_Send(globalBuffer.data(), globalSize, MPI_CHAR, m_ReaderMasterStreamRank, 0,
                 m_StreamComm);
    }
}